

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void bpmnode_sort(BPMNode *leaves,size_t num)

{
  bool bVar1;
  void *pvVar2;
  void *src;
  undefined8 *puVar3;
  undefined8 *puVar4;
  ulong in_RSI;
  void *in_RDI;
  size_t k;
  size_t j;
  size_t i;
  size_t r;
  size_t q;
  size_t p;
  BPMNode *b;
  BPMNode *a;
  size_t counter;
  size_t width;
  BPMNode *mem;
  ulong local_88;
  ulong local_80;
  void *local_78;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_40;
  ulong local_20;
  
  src = lodepng_malloc(0x15fbff);
  bVar1 = false;
  for (local_20 = 1; local_20 < in_RSI; local_20 = local_20 << 1) {
    local_78 = src;
    pvVar2 = in_RDI;
    if (bVar1) {
      local_78 = in_RDI;
      pvVar2 = src;
    }
    for (local_40 = 0; local_40 < in_RSI; local_40 = local_20 * 2 + local_40) {
      local_80 = in_RSI;
      if (local_40 + local_20 <= in_RSI) {
        local_80 = local_40 + local_20;
      }
      local_88 = in_RSI;
      if (local_40 + local_20 * 2 <= in_RSI) {
        local_88 = local_40 + local_20 * 2;
      }
      local_58 = local_40;
      local_60 = local_80;
      for (local_68 = local_40; local_68 < local_88; local_68 = local_68 + 1) {
        if ((local_58 < local_80) &&
           ((local_88 <= local_60 ||
            (*(int *)((long)pvVar2 + local_58 * 0x18) <= *(int *)((long)pvVar2 + local_60 * 0x18))))
           ) {
          puVar4 = (undefined8 *)((long)pvVar2 + local_58 * 0x18);
          puVar3 = (undefined8 *)((long)local_78 + local_68 * 0x18);
          *puVar3 = *puVar4;
          puVar3[1] = puVar4[1];
          puVar3[2] = puVar4[2];
          local_58 = local_58 + 1;
        }
        else {
          puVar4 = (undefined8 *)((long)pvVar2 + local_60 * 0x18);
          puVar3 = (undefined8 *)((long)local_78 + local_68 * 0x18);
          *puVar3 = *puVar4;
          puVar3[1] = puVar4[1];
          puVar3[2] = puVar4[2];
          local_60 = local_60 + 1;
        }
      }
    }
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (bVar1) {
    lodepng_memcpy(in_RDI,src,in_RSI * 0x18);
  }
  lodepng_free((void *)0x15fe83);
  return;
}

Assistant:

static void bpmnode_sort(BPMNode* leaves, size_t num) {
  BPMNode* mem = (BPMNode*)lodepng_malloc(sizeof(*leaves) * num);
  size_t width, counter = 0;
  for (width = 1; width < num; width *= 2) {
    BPMNode* a = (counter & 1) ? mem : leaves;
    BPMNode* b = (counter & 1) ? leaves : mem;
    size_t p;
    for (p = 0; p < num; p += 2 * width) {
      size_t q = (p + width > num) ? num : (p + width);
      size_t r = (p + 2 * width > num) ? num : (p + 2 * width);
      size_t i = p, j = q, k;
      for (k = p; k < r; k++) {
        if (i < q && (j >= r || a[i].weight <= a[j].weight)) b[k] = a[i++];
        else b[k] = a[j++];
      }
    }
    counter++;
  }
  if (counter & 1) lodepng_memcpy(leaves, mem, sizeof(*leaves) * num);
  lodepng_free(mem);
}